

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

uint8_t * google::protobuf::io::(anonymous_namespace)::DecodeVarint64KnownSize<10ul>
                    (uint8_t *buffer,uint64_t *value)

{
  byte bVar1;
  size_t offset;
  size_t i;
  uint64_t result;
  uint64_t *value_local;
  uint8_t *buffer_local;
  
  i = (ulong)buffer[9] << 0x3f;
  bVar1 = 0;
  for (offset = 0; offset < 9; offset = offset + 1) {
    i = ((long)(int)(buffer[offset] - 0x80) << (bVar1 & 0x3f)) + i;
    bVar1 = bVar1 + 7;
  }
  *value = i;
  return buffer + 10;
}

Assistant:

const uint8_t* DecodeVarint64KnownSize(const uint8_t* buffer, uint64_t* value) {
  GOOGLE_DCHECK_GT(N, 0);
  uint64_t result = static_cast<uint64_t>(buffer[N - 1]) << (7 * (N - 1));
  for (size_t i = 0, offset = 0; i < N - 1; i++, offset += 7) {
    result += static_cast<uint64_t>(buffer[i] - 0x80) << offset;
  }
  *value = result;
  return buffer + N;
}